

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O0

char_range __thiscall
poplar::compact_bonsai_nlm<int,_16UL>::get_slice_
          (compact_bonsai_nlm<int,_16UL> *this,uint64_t chunk_id,uint64_t pos_in_chunk)

{
  char_range cVar1;
  bool bVar2;
  const_reference pvVar3;
  uint64_t uVar4;
  uint64_t in_RDX;
  size_type in_RSI;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  *in_RDI;
  uint64_t vsize;
  uint64_t i;
  uint64_t len;
  uint64_t offset;
  uint8_t *ptr;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffffb0;
  uint16_t x;
  ulong local_48;
  uint64_t local_40;
  ulong local_38;
  pointer local_30;
  uint64_t local_28;
  size_type local_20;
  uint8_t *local_10;
  uint8_t *local_8;
  
  local_28 = in_RDX;
  local_20 = in_RSI;
  pvVar3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 1),in_RSI
                     );
  bVar2 = bit_tools::get_bit(*pvVar3,local_28);
  if (bVar2) {
    std::
    vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ::operator[](in_RDI,local_20);
    local_30 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         (in_stack_ffffffffffffffb0);
    x = (uint16_t)((ulong)in_stack_ffffffffffffffb0 >> 0x30);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 1),local_20);
    local_38 = bit_tools::popcnt(x,(uint64_t)in_RDI);
    local_40 = 0;
    for (local_48 = 0; local_48 < local_38; local_48 = local_48 + 1) {
      uVar4 = vbyte::decode(local_30,&local_40);
      local_30 = local_30 + local_40 + uVar4;
    }
    uVar4 = vbyte::decode(local_30,&local_40);
    local_10 = local_30;
    local_8 = local_30 + uVar4 + local_40;
  }
  else {
    local_10 = (uint8_t *)0x0;
    local_8 = (uint8_t *)0x0;
  }
  cVar1.end = local_8;
  cVar1.begin = local_10;
  return cVar1;
}

Assistant:

char_range get_slice_(uint64_t chunk_id, uint64_t pos_in_chunk) const {
        if (!bit_tools::get_bit(chunks_[chunk_id], pos_in_chunk)) {
            // pos indicates a step node
            return {nullptr, nullptr};
        }

        const uint8_t* ptr = ptrs_[chunk_id].get();
        assert(ptr != nullptr);

        const uint64_t offset = bit_tools::popcnt(chunks_[chunk_id], pos_in_chunk);

        // Proceeds the target position
        uint64_t len = 0;
        for (uint64_t i = 0; i < offset; ++i) {
            ptr += vbyte::decode(ptr, len);
            ptr += len;
        }

        uint64_t vsize = vbyte::decode(ptr, len);
        return {ptr, ptr + (vsize + len)};
    }